

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntTest.hpp
# Opt level: O3

void Qentem::Test::PrintDigits<Qentem::BigInt<unsigned_long_long,1024u>>
               (BigInt<unsigned_long_long,_1024U> *b_int,StringStream<char> *stream)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  SizeT new_length;
  SizeT new_capacity;
  char storage [309];
  undefined8 uStack_160;
  char local_158 [312];
  
  local_158[0x100] = '\0';
  local_158[0x101] = '\0';
  local_158[0x102] = '\0';
  local_158[0x103] = '\0';
  local_158[0x104] = '\0';
  local_158[0x105] = '\0';
  local_158[0x106] = '\0';
  local_158[0x107] = '\0';
  local_158[0x108] = '\0';
  local_158[0x109] = '\0';
  local_158[0x10a] = '\0';
  local_158[0x10b] = '\0';
  local_158[0x10c] = '\0';
  local_158[0x10d] = '\0';
  local_158[0x10e] = '\0';
  local_158[0x10f] = '\0';
  local_158[0x110] = '\0';
  local_158[0x111] = '\0';
  local_158[0x112] = '\0';
  local_158[0x113] = '\0';
  local_158[0x114] = '\0';
  local_158[0x115] = '\0';
  local_158[0x116] = '\0';
  local_158[0x117] = '\0';
  local_158[0x118] = '\0';
  local_158[0x119] = '\0';
  local_158[0x11a] = '\0';
  local_158[0x11b] = '\0';
  local_158[0x11c] = '\0';
  local_158[0x11d] = '\0';
  local_158[0x11e] = '\0';
  local_158[0x11f] = '\0';
  local_158[0x120] = '\0';
  local_158[0x121] = '\0';
  local_158[0x122] = '\0';
  local_158[0x123] = '\0';
  local_158[0x124] = '\0';
  local_158[0x125] = '\0';
  local_158[0x126] = '\0';
  local_158[0x127] = '\0';
  local_158[0x128] = '\0';
  local_158[0x129] = '\0';
  local_158[0x12a] = '\0';
  local_158[299] = '\0';
  local_158[300] = '\0';
  local_158[0x12d] = '\0';
  local_158[0x12e] = '\0';
  local_158[0x12f] = '\0';
  local_158[0x130] = '\0';
  local_158[0x131] = '\0';
  local_158[0x132] = '\0';
  local_158[0x133] = '\0';
  local_158[0x134] = '\0';
  local_158[0xc0] = '\0';
  local_158[0xc1] = '\0';
  local_158[0xc2] = '\0';
  local_158[0xc3] = '\0';
  local_158[0xc4] = '\0';
  local_158[0xc5] = '\0';
  local_158[0xc6] = '\0';
  local_158[199] = '\0';
  local_158[200] = '\0';
  local_158[0xc9] = '\0';
  local_158[0xca] = '\0';
  local_158[0xcb] = '\0';
  local_158[0xcc] = '\0';
  local_158[0xcd] = '\0';
  local_158[0xce] = '\0';
  local_158[0xcf] = '\0';
  local_158[0xd0] = '\0';
  local_158[0xd1] = '\0';
  local_158[0xd2] = '\0';
  local_158[0xd3] = '\0';
  local_158[0xd4] = '\0';
  local_158[0xd5] = '\0';
  local_158[0xd6] = '\0';
  local_158[0xd7] = '\0';
  local_158[0xd8] = '\0';
  local_158[0xd9] = '\0';
  local_158[0xda] = '\0';
  local_158[0xdb] = '\0';
  local_158[0xdc] = '\0';
  local_158[0xdd] = '\0';
  local_158[0xde] = '\0';
  local_158[0xdf] = '\0';
  local_158[0xe0] = '\0';
  local_158[0xe1] = '\0';
  local_158[0xe2] = '\0';
  local_158[0xe3] = '\0';
  local_158[0xe4] = '\0';
  local_158[0xe5] = '\0';
  local_158[0xe6] = '\0';
  local_158[0xe7] = '\0';
  local_158[0xe8] = '\0';
  local_158[0xe9] = '\0';
  local_158[0xea] = '\0';
  local_158[0xeb] = '\0';
  local_158[0xec] = '\0';
  local_158[0xed] = '\0';
  local_158[0xee] = '\0';
  local_158[0xef] = '\0';
  local_158[0xf0] = '\0';
  local_158[0xf1] = '\0';
  local_158[0xf2] = '\0';
  local_158[0xf3] = '\0';
  local_158[0xf4] = '\0';
  local_158[0xf5] = '\0';
  local_158[0xf6] = '\0';
  local_158[0xf7] = '\0';
  local_158[0xf8] = '\0';
  local_158[0xf9] = '\0';
  local_158[0xfa] = '\0';
  local_158[0xfb] = '\0';
  local_158[0xfc] = '\0';
  local_158[0xfd] = '\0';
  local_158[0xfe] = '\0';
  local_158[0xff] = '\0';
  local_158[0x80] = '\0';
  local_158[0x81] = '\0';
  local_158[0x82] = '\0';
  local_158[0x83] = '\0';
  local_158[0x84] = '\0';
  local_158[0x85] = '\0';
  local_158[0x86] = '\0';
  local_158[0x87] = '\0';
  local_158[0x88] = '\0';
  local_158[0x89] = '\0';
  local_158[0x8a] = '\0';
  local_158[0x8b] = '\0';
  local_158[0x8c] = '\0';
  local_158[0x8d] = '\0';
  local_158[0x8e] = '\0';
  local_158[0x8f] = '\0';
  local_158[0x90] = '\0';
  local_158[0x91] = '\0';
  local_158[0x92] = '\0';
  local_158[0x93] = '\0';
  local_158[0x94] = '\0';
  local_158[0x95] = '\0';
  local_158[0x96] = '\0';
  local_158[0x97] = '\0';
  local_158[0x98] = '\0';
  local_158[0x99] = '\0';
  local_158[0x9a] = '\0';
  local_158[0x9b] = '\0';
  local_158[0x9c] = '\0';
  local_158[0x9d] = '\0';
  local_158[0x9e] = '\0';
  local_158[0x9f] = '\0';
  local_158[0xa0] = '\0';
  local_158[0xa1] = '\0';
  local_158[0xa2] = '\0';
  local_158[0xa3] = '\0';
  local_158[0xa4] = '\0';
  local_158[0xa5] = '\0';
  local_158[0xa6] = '\0';
  local_158[0xa7] = '\0';
  local_158[0xa8] = '\0';
  local_158[0xa9] = '\0';
  local_158[0xaa] = '\0';
  local_158[0xab] = '\0';
  local_158[0xac] = '\0';
  local_158[0xad] = '\0';
  local_158[0xae] = '\0';
  local_158[0xaf] = '\0';
  local_158[0xb0] = '\0';
  local_158[0xb1] = '\0';
  local_158[0xb2] = '\0';
  local_158[0xb3] = '\0';
  local_158[0xb4] = '\0';
  local_158[0xb5] = '\0';
  local_158[0xb6] = '\0';
  local_158[0xb7] = '\0';
  local_158[0xb8] = '\0';
  local_158[0xb9] = '\0';
  local_158[0xba] = '\0';
  local_158[0xbb] = '\0';
  local_158[0xbc] = '\0';
  local_158[0xbd] = '\0';
  local_158[0xbe] = '\0';
  local_158[0xbf] = '\0';
  local_158[0x40] = '\0';
  local_158[0x41] = '\0';
  local_158[0x42] = '\0';
  local_158[0x43] = '\0';
  local_158[0x44] = '\0';
  local_158[0x45] = '\0';
  local_158[0x46] = '\0';
  local_158[0x47] = '\0';
  local_158[0x48] = '\0';
  local_158[0x49] = '\0';
  local_158[0x4a] = '\0';
  local_158[0x4b] = '\0';
  local_158[0x4c] = '\0';
  local_158[0x4d] = '\0';
  local_158[0x4e] = '\0';
  local_158[0x4f] = '\0';
  local_158[0x50] = '\0';
  local_158[0x51] = '\0';
  local_158[0x52] = '\0';
  local_158[0x53] = '\0';
  local_158[0x54] = '\0';
  local_158[0x55] = '\0';
  local_158[0x56] = '\0';
  local_158[0x57] = '\0';
  local_158[0x58] = '\0';
  local_158[0x59] = '\0';
  local_158[0x5a] = '\0';
  local_158[0x5b] = '\0';
  local_158[0x5c] = '\0';
  local_158[0x5d] = '\0';
  local_158[0x5e] = '\0';
  local_158[0x5f] = '\0';
  local_158[0x60] = '\0';
  local_158[0x61] = '\0';
  local_158[0x62] = '\0';
  local_158[99] = '\0';
  local_158[100] = '\0';
  local_158[0x65] = '\0';
  local_158[0x66] = '\0';
  local_158[0x67] = '\0';
  local_158[0x68] = '\0';
  local_158[0x69] = '\0';
  local_158[0x6a] = '\0';
  local_158[0x6b] = '\0';
  local_158[0x6c] = '\0';
  local_158[0x6d] = '\0';
  local_158[0x6e] = '\0';
  local_158[0x6f] = '\0';
  local_158[0x70] = '\0';
  local_158[0x71] = '\0';
  local_158[0x72] = '\0';
  local_158[0x73] = '\0';
  local_158[0x74] = '\0';
  local_158[0x75] = '\0';
  local_158[0x76] = '\0';
  local_158[0x77] = '\0';
  local_158[0x78] = '\0';
  local_158[0x79] = '\0';
  local_158[0x7a] = '\0';
  local_158[0x7b] = '\0';
  local_158[0x7c] = '\0';
  local_158[0x7d] = '\0';
  local_158[0x7e] = '\0';
  local_158[0x7f] = '\0';
  local_158[0] = '\0';
  local_158[1] = '\0';
  local_158[2] = '\0';
  local_158[3] = '\0';
  local_158[4] = '\0';
  local_158[5] = '\0';
  local_158[6] = '\0';
  local_158[7] = '\0';
  local_158[8] = '\0';
  local_158[9] = '\0';
  local_158[10] = '\0';
  local_158[0xb] = '\0';
  local_158[0xc] = '\0';
  local_158[0xd] = '\0';
  local_158[0xe] = '\0';
  local_158[0xf] = '\0';
  local_158[0x10] = '\0';
  local_158[0x11] = '\0';
  local_158[0x12] = '\0';
  local_158[0x13] = '\0';
  local_158[0x14] = '\0';
  local_158[0x15] = '\0';
  local_158[0x16] = '\0';
  local_158[0x17] = '\0';
  local_158[0x18] = '\0';
  local_158[0x19] = '\0';
  local_158[0x1a] = '\0';
  local_158[0x1b] = '\0';
  local_158[0x1c] = '\0';
  local_158[0x1d] = '\0';
  local_158[0x1e] = '\0';
  local_158[0x1f] = '\0';
  local_158[0x20] = '\0';
  local_158[0x21] = '\0';
  local_158[0x22] = '\0';
  local_158[0x23] = '\0';
  local_158[0x24] = '\0';
  local_158[0x25] = '\0';
  local_158[0x26] = '\0';
  local_158[0x27] = '\0';
  local_158[0x28] = '\0';
  local_158[0x29] = '\0';
  local_158[0x2a] = '\0';
  local_158[0x2b] = '\0';
  local_158[0x2c] = '\0';
  local_158[0x2d] = '\0';
  local_158[0x2e] = '\0';
  local_158[0x2f] = '\0';
  local_158[0x30] = '\0';
  local_158[0x31] = '\0';
  local_158[0x32] = '\0';
  local_158[0x33] = '\0';
  local_158[0x34] = '\0';
  local_158[0x35] = '\0';
  local_158[0x36] = '\0';
  local_158[0x37] = '\0';
  local_158[0x38] = '\0';
  local_158[0x39] = '\0';
  local_158[0x3a] = '\0';
  local_158[0x3b] = '\0';
  local_158[0x3c] = '\0';
  local_158[0x3d] = '\0';
  local_158[0x3e] = '\0';
  local_158[0x3f] = '\0';
  uVar5 = b_int->index_;
  if ((uVar5 == 0) && (b_int->storage_[0] == 0)) {
    stream->length_ = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar10 = (ulong)uVar5;
      uVar3 = b_int->storage_[uVar10];
      b_int->storage_[uVar10] = uVar3 / 10;
      uVar3 = uVar3 % 10;
      cVar2 = (char)uVar3;
      uVar12 = uVar10;
      if (uVar5 == 0) {
        iVar11 = 0;
      }
      else {
        do {
          uVar6 = b_int->storage_[uVar12 - 1] % 10;
          uVar4 = (uVar3 << 0x3c) / 0xa0000000;
          uVar8 = ((ulong)(uint)((int)uVar4 * 0x60000000) << 0x20) / 0xa0000000;
          uVar3 = (ulong)((uint)((int)uVar8 * 0x60000000) >> 0x1c);
          uVar1 = uVar3 + uVar6;
          uVar3 = (uVar3 - 10) + uVar6;
          if (uVar1 < 10) {
            uVar3 = uVar1;
          }
          cVar2 = (char)uVar3;
          b_int->storage_[uVar12 - 1] =
               (uVar8 + (uVar4 << 0x20) + b_int->storage_[uVar12 - 1] / 10 + 1) -
               (ulong)(uVar1 < 10);
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        iVar11 = -(uint)(b_int->storage_[uVar10] == 0);
      }
      uVar7 = uVar9 + 1;
      uVar5 = uVar5 + iVar11;
      local_158[uVar9] = cVar2 + '0';
      uVar9 = uVar7;
    } while ((uVar5 != 0) || (b_int->storage_[0] != 0));
    b_int->index_ = 0;
    stream->length_ = 0;
    if (uVar7 != 0) {
      new_capacity = 1;
      uVar3 = (ulong)uVar7;
      do {
        cVar2 = *(char *)((long)&uStack_160 + uVar3 + 7);
        uVar5 = new_capacity - 1;
        if (uVar5 == stream->capacity_) {
          uStack_160 = 0x10929d;
          StringStream<char>::expand(stream,new_capacity);
          uVar5 = stream->length_;
        }
        uVar3 = uVar3 - 1;
        stream->storage_[uVar5] = cVar2;
        stream->length_ = new_capacity;
        new_capacity = new_capacity + 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

static void PrintDigits(BigInt_T b_int, StringStream<char> &stream) {
    constexpr unsigned int max = (((b_int.TotalBits() * 30103U) / 100000U) + 1U);
    char                   storage[max]{0};
    unsigned int           index = 0;

    StreamDigits(&(storage[0]), index, b_int);

    stream.Clear();

    while (index != 0) {
        --index;
        stream << storage[index];
    }
}